

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall BpTree<int>::DeleteKey(BpTree<int> *this,int k,Addr p)

{
  Addr p_00;
  undefined1 local_90 [8];
  IndexNode<int> C;
  int iStack_20;
  Addr pos;
  int k_local;
  BpTree<int> *this_local;
  Addr p_local;
  
  unique0x1000008a = p;
  p_00 = FindLeafAddr(this,k,p);
  iStack_20 = p_00.FileOff;
  if (iStack_20 != -1) {
    IndexNode<int>::IndexNode((IndexNode<int> *)local_90,this->N);
    FindNode(this,p_00,(IndexNode<int> *)local_90);
    Delete_Aux(this,(IndexNode<int> *)local_90,k,p);
    IndexNode<int>::~IndexNode((IndexNode<int> *)local_90);
  }
  return;
}

Assistant:

void BpTree<K>::DeleteKey(K k, Addr p) {
	Addr pos = this->FindLeafAddr(k, p);
	if (pos.FileOff != -1) {
		IndexNode<K> C(N);
		this->FindNode(pos, C);
		this->Delete_Aux(C, k, p);
	}
	else
		//cout << "Cannot find the key!" << endl;
	return;
}